

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,sc_unsigned *u,long v)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  size_t __n;
  sc_length_param *psVar4;
  int iVar5;
  ulong uVar6;
  sc_digit vd [3];
  
  iVar1 = u->sgn;
  iVar5 = 1;
  if (v < 1) {
    if (v == 0) goto LAB_001d6bac;
    bVar2 = (ulong)v < 0x8000000000000001;
    v = -v;
    if (bVar2) {
      v = 0x8000000000000000;
    }
    iVar5 = -1;
  }
  if (iVar1 != 0) {
    __n = 0xc;
    uVar3 = 0;
    do {
      uVar6 = uVar3;
      vd[uVar6] = (uint)v & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar6) break;
      bVar2 = 0x3fffffff < (ulong)v;
      uVar3 = uVar6 + 1;
      v = (ulong)v >> 0x1e;
    } while (bVar2);
    if (uVar6 < 2) {
      memset(vd + uVar6 + 1,0,__n);
    }
    mul_signed_friend(__return_storage_ptr__,(uint)(iVar1 == iVar5) * 2 + -1,u->nbits,u->ndigits,
                      u->digit,0x40,3,vd);
    return __return_storage_ptr__;
  }
LAB_001d6bac:
  psVar4 = sc_context<sc_dt::sc_length_param>::default_value();
  sc_signed::sc_signed(__return_storage_ptr__,psVar4->m_len);
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(const sc_unsigned& u, long v)
{

  small_type s = mul_signs(u.sgn, get_sign(v));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(v);

  // cases 2-4
  return mul_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}